

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfread.c
# Opt level: O0

FT_Error pcf_interpret_style(PCF_Face pcf)

{
  FT_Memory memory_00;
  void *__src;
  ulong __n;
  PCF_Property pPVar1;
  size_t sVar2;
  FT_String *pFVar3;
  ulong local_a0;
  size_t mm;
  char *src;
  char *s;
  size_t lengths [4];
  char *strings [4];
  size_t len;
  size_t nn;
  PCF_Property prop;
  FT_Memory memory;
  FT_Face face;
  PCF_Face pPStack_18;
  FT_Error error;
  PCF_Face pcf_local;
  
  face._4_4_ = 0;
  memory_00 = (pcf->root).memory;
  pPStack_18 = pcf;
  memset(lengths + 3,0,0x20);
  (pcf->root).style_flags = 0;
  pPVar1 = pcf_find_property(pPStack_18,"SLANT");
  if (((pPVar1 != (PCF_Property)0x0) && (pPVar1->isString != '\0')) &&
     ((*(pPVar1->value).atom == 'O' ||
      (((*(pPVar1->value).atom == 'o' || (*(pPVar1->value).atom == 'I')) ||
       (*(pPVar1->value).atom == 'i')))))) {
    (pcf->root).style_flags = (pcf->root).style_flags | 1;
  }
  pPVar1 = pcf_find_property(pPStack_18,"WEIGHT_NAME");
  if (((pPVar1 != (PCF_Property)0x0) && (pPVar1->isString != '\0')) &&
     ((*(pPVar1->value).atom == 'B' || (*(pPVar1->value).atom == 'b')))) {
    (pcf->root).style_flags = (pcf->root).style_flags | 2;
  }
  pcf_find_property(pPStack_18,"SETWIDTH_NAME");
  pPVar1 = pcf_find_property(pPStack_18,"ADD_STYLE_NAME");
  if (((pPVar1 != (PCF_Property)0x0) && (pPVar1->isString != '\0')) &&
     ((*(pPVar1->value).atom != '\0' &&
      ((*(pPVar1->value).atom != 'N' && (*(pPVar1->value).atom != 'n')))))) {
    lengths[3] = (pPVar1->value).ul;
  }
  strings[3] = (char *)0x0;
  for (len = 0; len < 4; len = len + 1) {
    lengths[len - 1] = 0;
    if (lengths[len + 3] != 0) {
      sVar2 = strlen((char *)lengths[len + 3]);
      lengths[len - 1] = sVar2;
      strings[3] = strings[3] + lengths[len - 1] + 1;
    }
  }
  if (strings[3] == (char *)0x0) {
    lengths[3] = (size_t)anon_var_dwarf_2ff9b;
    sVar2 = strlen("Regular");
    strings[3] = (char *)(sVar2 + 1);
  }
  pFVar3 = (FT_String *)ft_mem_alloc(memory_00,(FT_Long)strings[3],(FT_Error *)((long)&face + 4));
  (pcf->root).style_name = pFVar3;
  if (face._4_4_ == 0) {
    src = (pcf->root).style_name;
    for (len = 0; len < 4; len = len + 1) {
      __src = (void *)lengths[len + 3];
      __n = lengths[len - 1];
      if (__src != (void *)0x0) {
        if (src != (pcf->root).style_name) {
          *src = ' ';
          src = src + 1;
        }
        memcpy(src,__src,__n);
        if ((len == 0) || (len == 3)) {
          for (local_a0 = 0; local_a0 < __n; local_a0 = local_a0 + 1) {
            if (src[local_a0] == ' ') {
              src[local_a0] = '-';
            }
          }
        }
        src = src + __n;
      }
    }
    *src = '\0';
    pcf_local._4_4_ = face._4_4_;
  }
  else {
    pcf_local._4_4_ = face._4_4_;
  }
  return pcf_local._4_4_;
}

Assistant:

static FT_Error
  pcf_interpret_style( PCF_Face  pcf )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Face    face   = FT_FACE( pcf );
    FT_Memory  memory = face->memory;

    PCF_Property  prop;

    size_t  nn, len;
    char*   strings[4] = { NULL, NULL, NULL, NULL };
    size_t  lengths[4];


    face->style_flags = 0;

    prop = pcf_find_property( pcf, "SLANT" );
    if ( prop && prop->isString                                       &&
         ( *(prop->value.atom) == 'O' || *(prop->value.atom) == 'o' ||
           *(prop->value.atom) == 'I' || *(prop->value.atom) == 'i' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_ITALIC;
      strings[2] = ( *(prop->value.atom) == 'O' ||
                     *(prop->value.atom) == 'o' ) ? (char *)"Oblique"
                                                  : (char *)"Italic";
    }

    prop = pcf_find_property( pcf, "WEIGHT_NAME" );
    if ( prop && prop->isString                                       &&
         ( *(prop->value.atom) == 'B' || *(prop->value.atom) == 'b' ) )
    {
      face->style_flags |= FT_STYLE_FLAG_BOLD;
      strings[1] = (char*)"Bold";
    }

    prop = pcf_find_property( pcf, "SETWIDTH_NAME" );
    if ( prop && prop->isString                                        &&
         *(prop->value.atom)                                           &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[3] = (char*)( prop->value.atom );

    prop = pcf_find_property( pcf, "ADD_STYLE_NAME" );
    if ( prop && prop->isString                                        &&
         *(prop->value.atom)                                           &&
         !( *(prop->value.atom) == 'N' || *(prop->value.atom) == 'n' ) )
      strings[0] = (char*)( prop->value.atom );

    for ( len = 0, nn = 0; nn < 4; nn++ )
    {
      lengths[nn] = 0;
      if ( strings[nn] )
      {
        lengths[nn] = ft_strlen( strings[nn] );
        len        += lengths[nn] + 1;
      }
    }

    if ( len == 0 )
    {
      strings[0] = (char*)"Regular";
      lengths[0] = ft_strlen( strings[0] );
      len        = lengths[0] + 1;
    }

    {
      char*  s;


      if ( FT_ALLOC( face->style_name, len ) )
        return error;

      s = face->style_name;

      for ( nn = 0; nn < 4; nn++ )
      {
        char*  src = strings[nn];


        len = lengths[nn];

        if ( !src )
          continue;

        /* separate elements with a space */
        if ( s != face->style_name )
          *s++ = ' ';

        ft_memcpy( s, src, len );

        /* need to convert spaces to dashes for */
        /* add_style_name and setwidth_name     */
        if ( nn == 0 || nn == 3 )
        {
          size_t  mm;


          for ( mm = 0; mm < len; mm++ )
            if ( s[mm] == ' ' )
              s[mm] = '-';
        }

        s += len;
      }
      *s = 0;
    }

    return error;
  }